

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::GlobalClockFunction::GlobalClockFunction(GlobalClockFunction *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,GlobalClock,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_0058acb8;
  return;
}

Assistant:

GlobalClockFunction() :
        SystemSubroutine(KnownSystemName::GlobalClock, SubroutineKind::Function) {}